

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O1

void scalar_encode(uint8_t *out,scalar *s,int bits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int i;
  long lVar5;
  byte bVar6;
  int iVar7;
  
  lVar5 = 0;
  iVar1 = 0;
  bVar6 = 0;
  do {
    if (0 < bits) {
      uVar2 = (uint)s->c[lVar5];
      iVar3 = 0;
      do {
        iVar7 = bits - iVar3;
        iVar4 = 8 - iVar1;
        if (iVar7 < iVar4) {
          bVar6 = bVar6 | (byte)((*(byte *)((long)kInverseNTTRoots + (long)iVar7 + 0xff) & uVar2) <<
                                ((byte)iVar1 & 0x1f));
          iVar1 = iVar1 + iVar7;
          iVar4 = iVar7;
        }
        else {
          *out = bVar6 | (byte)((mlkem::(anonymous_namespace)::kMasks[7 - iVar1] & uVar2) <<
                               ((byte)iVar1 & 0x1f));
          out = out + 1;
          bVar6 = 0;
          iVar1 = 0;
        }
        iVar3 = iVar3 + iVar4;
        uVar2 = (uVar2 & 0xffff) >> ((byte)iVar4 & 0x1f);
      } while (iVar3 < bits);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  if (0 < iVar1) {
    *out = bVar6;
  }
  return;
}

Assistant:

static void scalar_encode(uint8_t *out, const scalar *s, int bits) {
  assert(bits <= (int)sizeof(*s->c) * 8 && bits != 1);

  uint8_t out_byte = 0;
  int out_byte_bits = 0;

  for (int i = 0; i < DEGREE; i++) {
    uint16_t element = s->c[i];
    int element_bits_done = 0;

    while (element_bits_done < bits) {
      int chunk_bits = bits - element_bits_done;
      int out_bits_remaining = 8 - out_byte_bits;
      if (chunk_bits >= out_bits_remaining) {
        chunk_bits = out_bits_remaining;
        out_byte |= (element & kMasks[chunk_bits - 1]) << out_byte_bits;
        *out = out_byte;
        out++;
        out_byte_bits = 0;
        out_byte = 0;
      } else {
        out_byte |= (element & kMasks[chunk_bits - 1]) << out_byte_bits;
        out_byte_bits += chunk_bits;
      }

      element_bits_done += chunk_bits;
      element >>= chunk_bits;
    }
  }

  if (out_byte_bits > 0) {
    *out = out_byte;
  }
}